

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O2

int count_from(int v,int skip,bool clean)

{
  int iVar1;
  undefined7 in_register_00000011;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_19;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedcnt,(long)V,false);
  if ((int)CONCAT71(in_register_00000011,clean) != 0) {
    local_19 = false;
    __first.super__Bit_iterator_base._8_8_ = 0;
    __first.super__Bit_iterator_base._M_p = (_Bit_type *)(anonymous_namespace)::usedcnt;
    __last.super__Bit_iterator_base._M_offset = DAT_0011f188;
    __last.super__Bit_iterator_base._M_p = (_Bit_type *)DAT_0011f180;
    __last.super__Bit_iterator_base._12_4_ = 0;
    std::__fill_a1(__first,__last,&local_19);
  }
  iVar1 = count_rec(v,skip);
  return iVar1;
}

Assistant:

int count_from(int v, int skip, bool clean = true){
    usedcnt.resize(V, false);

    if (clean) {
        fill(usedcnt.begin(), usedcnt.end(), false);
    }

    return count_rec(v, skip);
}